

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  deUint32 colorFormat_;
  TestNode *pTVar1;
  TestNode *pTVar2;
  RecreateBuffersTest *pRVar3;
  ulong extraout_RAX;
  ulong uVar4;
  undefined1 local_224 [8];
  FboConfig config_6;
  int typeNdx_6;
  bool stencil_2;
  bool depth_2;
  deUint32 colorFmt_2;
  deUint32 colorType_3;
  int fmtNdx_2;
  TestCaseGroup *recreateDepthStencilGroup;
  FboConfig config_5;
  int typeNdx_5;
  deUint32 depthStencilType_1;
  deUint32 depthStencilFormat_1;
  deUint32 colorFormat_1;
  int colorFmtNdx_3;
  TestCaseGroup *recreateColorGroup;
  FboConfig config_4;
  int typeNdx_4;
  bool stencil_1;
  int iStack_178;
  bool depth_1;
  deUint32 colorType_2;
  int depthStencilFmtNdx;
  FboConfig config_3;
  int typeNdx_3;
  deUint32 colorFormat;
  int colorFmtNdx_2;
  TestCaseGroup *resizeGroup;
  FboConfig config_2;
  int typeNdx_2;
  bool stencil;
  bool depth;
  deUint32 colorFmt_1;
  deUint32 colorType_1;
  int fmtNdx_1;
  TestCaseGroup *sharedDepthStencilGroup;
  FboConfig colorDepthStencilConfig;
  FboConfig colorDepthConfig;
  FboConfig colorOnlyConfig;
  int typeNdx_1;
  deUint32 depthStencilFormat;
  deUint32 depthStencilType;
  int colorFmtNdx_1;
  TestCaseGroup *sharedColorbufferGroup;
  FboConfig config_1;
  int typeNdx;
  int colorFmtNdx;
  TestCaseGroup *sharedColorbufferClearGroup;
  FboConfig config;
  deUint32 colorFmt;
  deUint32 stencilType;
  deUint32 colorType;
  int fmtNdx;
  TestCaseGroup *stencilClearGroup;
  FboRenderTestGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_clear","Stencil buffer clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (stencilType = 0; (int)stencilType < 6; stencilType = stencilType + 1) {
    config.samples = 0x8d41;
    config.height = 0x8058;
    if ((init::depthStencilFormats[(int)stencilType].stencil & 1U) != 0) {
      FboConfig::FboConfig
                ((FboConfig *)((long)&sharedColorbufferClearGroup + 4),0x4400,0xde1,0x8058,0x8d41,
                 init::depthStencilFormats[(int)stencilType].format,0,0,0);
      pTVar2 = (TestNode *)operator_new(0x98);
      FboCases::StencilClearsTest::StencilClearsTest
                ((StencilClearsTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                 (FboConfig *)((long)&sharedColorbufferClearGroup + 4));
      tcu::TestNode::addChild(pTVar1,pTVar2);
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shared_colorbuffer_clear","Shader colorbuffer clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (config_1.samples = 0; config_1.samples < 0x24; config_1.samples = config_1.samples + 1) {
    if ((init::colorFormats[config_1.samples].type != FORMATTYPE_INT) &&
       (init::colorFormats[config_1.samples].type != FORMATTYPE_UINT)) {
      for (config_1.height = 0; config_1.height < 2; config_1.height = config_1.height + 1) {
        FboConfig::FboConfig
                  ((FboConfig *)&sharedColorbufferGroup,0x4000,init::objectTypes[config_1.height],
                   init::colorFormats[config_1.samples].format,0,0,0,0,0);
        pTVar2 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                  ((SharedColorbufferClearsTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                   (FboConfig *)&sharedColorbufferGroup);
        tcu::TestNode::addChild(pTVar1,pTVar2);
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shared_colorbuffer","Shared colorbuffer tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (depthStencilFormat = 0; (int)depthStencilFormat < 0x24;
      depthStencilFormat = depthStencilFormat + 1) {
    if (((((init::colorFormats[(int)depthStencilFormat].type != FORMATTYPE_INT) &&
          (init::colorFormats[(int)depthStencilFormat].type != FORMATTYPE_UINT)) &&
         (init::colorFormats[(int)depthStencilFormat].format != 0x8814)) &&
        ((init::colorFormats[(int)depthStencilFormat].format != 0x8815 &&
         (init::colorFormats[(int)depthStencilFormat].format != 0x8230)))) &&
       (init::colorFormats[(int)depthStencilFormat].format != 0x822e)) {
      for (colorOnlyConfig.height = 0; colorOnlyConfig.height < 2;
          colorOnlyConfig.height = colorOnlyConfig.height + 1) {
        FboConfig::FboConfig
                  ((FboConfig *)&colorDepthConfig.height,0x4000,
                   init::objectTypes[colorOnlyConfig.height],
                   init::colorFormats[(int)depthStencilFormat].format,0,0,0,0,0);
        FboConfig::FboConfig
                  ((FboConfig *)&colorDepthStencilConfig.height,0x4100,
                   init::objectTypes[colorOnlyConfig.height],
                   init::colorFormats[(int)depthStencilFormat].format,0x8d41,0x88f0,0,0,0);
        FboConfig::FboConfig
                  ((FboConfig *)&sharedDepthStencilGroup,0x4500,
                   init::objectTypes[colorOnlyConfig.height],
                   init::colorFormats[(int)depthStencilFormat].format,0x8d41,0x88f0,0,0,0);
        pTVar2 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                   (FboConfig *)&colorDepthConfig.height);
        tcu::TestNode::addChild(pTVar1,pTVar2);
        pTVar2 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                   (FboConfig *)&colorDepthStencilConfig.height);
        tcu::TestNode::addChild(pTVar1,pTVar2);
        pTVar2 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                   (FboConfig *)&sharedDepthStencilGroup);
        tcu::TestNode::addChild(pTVar1,pTVar2);
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shared_depth_stencil","Shared depth and stencil buffers");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (colorFmt_1 = 0; (int)colorFmt_1 < 6; colorFmt_1 = colorFmt_1 + 1) {
    config_2.samples._3_1_ = init::depthStencilFormats[(int)colorFmt_1].depth & 1;
    config_2.samples._2_1_ = init::depthStencilFormats[(int)colorFmt_1].stencil & 1;
    if (config_2.samples._3_1_ != 0) {
      for (config_2.height = 0; config_2.height < 2; config_2.height = config_2.height + 1) {
        FboConfig::FboConfig
                  ((FboConfig *)((long)&resizeGroup + 4),
                   (config_2.samples._3_1_ & 1) * 0x100 + 0x4000 +
                   (config_2.samples._2_1_ & 1) * 0x400,0xde1,0x8058,
                   init::objectTypes[config_2.height],
                   init::depthStencilFormats[(int)colorFmt_1].format,0,0,0);
        pTVar2 = (TestNode *)operator_new(0x98);
        FboCases::SharedDepthStencilTest::SharedDepthStencilTest
                  ((SharedDepthStencilTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                   (FboConfig *)((long)&resizeGroup + 4));
        tcu::TestNode::addChild(pTVar1,pTVar2);
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"resize",
             "FBO resize tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (typeNdx_3 = 0; typeNdx_3 < 0x24; typeNdx_3 = typeNdx_3 + 1) {
    config_3.samples = init::colorFormats[typeNdx_3].format;
    for (config_3.height = 0; config_3.height < 2; config_3.height = config_3.height + 1) {
      FboConfig::FboConfig
                ((FboConfig *)&colorType_2,0x4000,init::objectTypes[config_3.height],
                 config_3.samples,0,0,0,0,0);
      pTVar2 = (TestNode *)operator_new(0x98);
      FboCases::ResizeTest::ResizeTest
                ((ResizeTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                 (FboConfig *)&colorType_2);
      tcu::TestNode::addChild(pTVar1,pTVar2);
    }
    if ((config_3.samples == 0x8058) || (config_3.samples == 0x881a)) {
      for (iStack_178 = 0; iStack_178 < 6; iStack_178 = iStack_178 + 1) {
        config_4.samples._3_1_ = init::depthStencilFormats[iStack_178].depth & 1;
        config_4.samples._2_1_ = init::depthStencilFormats[iStack_178].stencil & 1;
        for (config_4.height = 0; config_4.height < 2; config_4.height = config_4.height + 1) {
          if (((config_4.samples._3_1_ & 1) != 0) || (init::objectTypes[config_4.height] == 0x8d41))
          {
            FboConfig::FboConfig
                      ((FboConfig *)((long)&recreateColorGroup + 4),
                       (config_4.samples._3_1_ & 1) * 0x100 + 0x4000 +
                       (config_4.samples._2_1_ & 1) * 0x400,0xde1,config_3.samples,
                       init::objectTypes[config_4.height],
                       init::depthStencilFormats[iStack_178].format,0,0,0);
            pTVar2 = (TestNode *)operator_new(0x98);
            FboCases::ResizeTest::ResizeTest
                      ((ResizeTest *)pTVar2,(this->super_TestCaseGroup).m_context,
                       (FboConfig *)((long)&recreateColorGroup + 4));
            tcu::TestNode::addChild(pTVar1,pTVar2);
          }
        }
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "recreate_color","Recreate colorbuffer tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (depthStencilFormat_1 = 0; (int)depthStencilFormat_1 < 0x24;
      depthStencilFormat_1 = depthStencilFormat_1 + 1) {
    colorFormat_ = init::colorFormats[(int)depthStencilFormat_1].format;
    config_5.samples = 0x8d41;
    for (config_5.height = 0; config_5.height < 2; config_5.height = config_5.height + 1) {
      FboConfig::FboConfig
                ((FboConfig *)((long)&recreateDepthStencilGroup + 4),0x4500,
                 init::objectTypes[config_5.height],colorFormat_,config_5.samples,0x88f0,0,0,0);
      pRVar3 = (RecreateBuffersTest *)operator_new(0xa0);
      FboCases::RecreateBuffersTest::RecreateBuffersTest
                (pRVar3,(this->super_TestCaseGroup).m_context,
                 (FboConfig *)((long)&recreateDepthStencilGroup + 4),0x4000,true);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar3);
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "recreate_depth_stencil","Recreate depth and stencil buffers");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  colorFmt_2 = 0;
  uVar4 = extraout_RAX;
  while ((int)colorFmt_2 < 6) {
    config_6.samples._3_1_ = init::depthStencilFormats[(int)colorFmt_2].depth & 1;
    config_6.samples._2_1_ = init::depthStencilFormats[(int)colorFmt_2].stencil & 1;
    for (config_6.height = 0; config_6.height < 2; config_6.height = config_6.height + 1) {
      if (((config_6.samples._3_1_ & 1) != 0) || (init::objectTypes[config_6.height] == 0x8d41)) {
        FboConfig::FboConfig
                  ((FboConfig *)local_224,
                   (config_6.samples._3_1_ & 1) * 0x100 + 0x4000 +
                   (config_6.samples._2_1_ & 1) * 0x400,0xde1,0x8058,
                   init::objectTypes[config_6.height],
                   init::depthStencilFormats[(int)colorFmt_2].format,0,0,0);
        pRVar3 = (RecreateBuffersTest *)operator_new(0xa0);
        FboCases::RecreateBuffersTest::RecreateBuffersTest
                  (pRVar3,(this->super_TestCaseGroup).m_context,(FboConfig *)local_224,
                   (config_6.samples._3_1_ & 1) << 8 | (config_6.samples._2_1_ & 1) << 10,true);
        tcu::TestNode::addChild(pTVar1,(TestNode *)pRVar3);
      }
    }
    colorFmt_2 = colorFmt_2 + 1;
    uVar4 = (ulong)colorFmt_2;
  }
  return (int)uVar4;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	static const deUint32 objectTypes[] =
	{
		GL_TEXTURE_2D,
		GL_RENDERBUFFER
	};

	enum FormatType
	{
		FORMATTYPE_FLOAT = 0,
		FORMATTYPE_FIXED,
		FORMATTYPE_INT,
		FORMATTYPE_UINT,

		FORMATTYPE_LAST
	};

	// Required by specification.
	static const struct
	{
		deUint32	format;
		FormatType	type;
	} colorFormats[] =
	{
		{ GL_RGBA32F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA32I,			FORMATTYPE_INT		},
		{ GL_RGBA32UI,			FORMATTYPE_UINT		},
		{ GL_RGBA16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA16I,			FORMATTYPE_INT		},
		{ GL_RGBA16UI,			FORMATTYPE_UINT		},
		{ GL_RGB16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA8,				FORMATTYPE_FIXED	},
		{ GL_RGBA8I,			FORMATTYPE_INT		},
		{ GL_RGBA8UI,			FORMATTYPE_UINT		},
		{ GL_SRGB8_ALPHA8,		FORMATTYPE_FIXED	},
		{ GL_RGB10_A2,			FORMATTYPE_FIXED	},
		{ GL_RGB10_A2UI,		FORMATTYPE_UINT		},
		{ GL_RGBA4,				FORMATTYPE_FIXED	},
		{ GL_RGB5_A1,			FORMATTYPE_FIXED	},
		{ GL_RGB8,				FORMATTYPE_FIXED	},
		{ GL_RGB565,			FORMATTYPE_FIXED	},
		{ GL_R11F_G11F_B10F,	FORMATTYPE_FLOAT	},
		{ GL_RG32F,				FORMATTYPE_FLOAT	},
		{ GL_RG32I,				FORMATTYPE_INT		},
		{ GL_RG32UI,			FORMATTYPE_UINT		},
		{ GL_RG16F,				FORMATTYPE_FLOAT	},
		{ GL_RG16I,				FORMATTYPE_INT		},
		{ GL_RG16UI,			FORMATTYPE_UINT		},
		{ GL_RG8,				FORMATTYPE_FLOAT	},
		{ GL_RG8I,				FORMATTYPE_INT		},
		{ GL_RG8UI,				FORMATTYPE_UINT		},
		{ GL_R32F,				FORMATTYPE_FLOAT	},
		{ GL_R32I,				FORMATTYPE_INT		},
		{ GL_R32UI,				FORMATTYPE_UINT		},
		{ GL_R16F,				FORMATTYPE_FLOAT	},
		{ GL_R16I,				FORMATTYPE_INT		},
		{ GL_R16UI,				FORMATTYPE_UINT		},
		{ GL_R8,				FORMATTYPE_FLOAT	},
		{ GL_R8I,				FORMATTYPE_INT		},
		{ GL_R8UI,				FORMATTYPE_UINT		}
	};

	static const struct
	{
		deUint32	format;
		bool		depth;
		bool		stencil;
	} depthStencilFormats[] =
	{
		{ GL_DEPTH_COMPONENT32F,	true,	false	},
		{ GL_DEPTH_COMPONENT24,		true,	false	},
		{ GL_DEPTH_COMPONENT16,		true,	false	},
		{ GL_DEPTH32F_STENCIL8,		true,	true	},
		{ GL_DEPTH24_STENCIL8,		true,	true	},
		{ GL_STENCIL_INDEX8,		false,	true	}
	};

	using namespace FboCases;

	// .stencil_clear
	tcu::TestCaseGroup* stencilClearGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_clear", "Stencil buffer clears");
	addChild(stencilClearGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType	= GL_TEXTURE_2D;
		deUint32	stencilType	= GL_RENDERBUFFER;
		deUint32	colorFmt	= GL_RGBA8;

		if (!depthStencilFormats[fmtNdx].stencil)
			continue;

		FboConfig config(GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, colorType, colorFmt, stencilType, depthStencilFormats[fmtNdx].format);
		stencilClearGroup->addChild(new StencilClearsTest(m_context, config));
	}

	// .shared_colorbuffer_clear
	tcu::TestCaseGroup* sharedColorbufferClearGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer_clear", "Shader colorbuffer clears");
	addChild(sharedColorbufferClearGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		// Clearing of integer buffers is undefined.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT || colorFormats[colorFmtNdx].type == FORMATTYPE_UINT)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			sharedColorbufferClearGroup->addChild(new SharedColorbufferClearsTest(m_context, config));
		}
	}

	// .shared_colorbuffer
	tcu::TestCaseGroup* sharedColorbufferGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer", "Shared colorbuffer tests");
	addChild(sharedColorbufferGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	depthStencilType	= GL_RENDERBUFFER;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;

		// Blending with integer buffers and fp32 targets is not supported.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT	||
			colorFormats[colorFmtNdx].type == FORMATTYPE_UINT	||
			colorFormats[colorFmtNdx].format == GL_RGBA32F		||
			colorFormats[colorFmtNdx].format == GL_RGB32F		||
			colorFormats[colorFmtNdx].format == GL_RG32F		||
			colorFormats[colorFmtNdx].format == GL_R32F)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig colorOnlyConfig			(GL_COLOR_BUFFER_BIT,											objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			FboConfig colorDepthConfig			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT,						objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);
			FboConfig colorDepthStencilConfig	(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT,	objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);

			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorOnlyConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthStencilConfig));
		}
	}

	// .shared_depth_stencil
	tcu::TestCaseGroup* sharedDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "shared_depth_stencil", "Shared depth and stencil buffers");
	addChild(sharedDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		if (!depth)
			continue; // Not verified.

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			sharedDepthStencilGroup->addChild(new SharedDepthStencilTest(m_context, config));
		}
	}

	// .resize
	tcu::TestCaseGroup* resizeGroup = new tcu::TestCaseGroup(m_testCtx, "resize", "FBO resize tests");
	addChild(resizeGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32 colorFormat = colorFormats[colorFmtNdx].format;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormat, GL_NONE, GL_NONE);
			resizeGroup->addChild(new ResizeTest(m_context, config));
		}

		// For selected color formats tests depth & stencil variants.
		if (colorFormat == GL_RGBA8 || colorFormat == GL_RGBA16F)
		{
			for (int depthStencilFmtNdx = 0; depthStencilFmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); depthStencilFmtNdx++)
			{
				deUint32	colorType		= GL_TEXTURE_2D;
				bool		depth			= depthStencilFormats[depthStencilFmtNdx].depth;
				bool		stencil			= depthStencilFormats[depthStencilFmtNdx].stencil;

				// Depth and stencil: both rbo and textures
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
				{
					if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
						continue; // Not supported.

					FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0),
									 colorType, colorFormat,
									 objectTypes[typeNdx], depthStencilFormats[depthStencilFmtNdx].format);
					resizeGroup->addChild(new ResizeTest(m_context, config));
				}
			}
		}
	}

	// .recreate_color
	tcu::TestCaseGroup* recreateColorGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_color", "Recreate colorbuffer tests");
	addChild(recreateColorGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	colorFormat			= colorFormats[colorFmtNdx].format;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;
		deUint32	depthStencilType	= GL_RENDERBUFFER;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, objectTypes[typeNdx], colorFormat, depthStencilType, depthStencilFormat);
			recreateColorGroup->addChild(new RecreateBuffersTest(m_context, config, GL_COLOR_BUFFER_BIT, true /* rebind */));
		}
	}

	// .recreate_depth_stencil
	tcu::TestCaseGroup* recreateDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_depth_stencil", "Recreate depth and stencil buffers");
	addChild(recreateDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
				continue;

			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			recreateDepthStencilGroup->addChild(new RecreateBuffersTest(m_context, config, (depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), true /* rebind */));
		}
	}
}